

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

BadStatusOrAccess * __thiscall
absl::lts_20240722::BadStatusOrAccess::operator=(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  ulong uVar1;
  ulong uVar2;
  anon_class_8_1_8991fb9c *in_RDX;
  BadStatusOrAccess *local_18;
  
  local_18 = other;
  if ((other->init_what_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20240722::BadStatusOrAccess::InitWhat()const::__0>
              (&(other->init_what_).control_,(SchedulingMode)&local_18,in_RDX);
  }
  uVar1 = (this->status_).rep_;
  uVar2 = (other->status_).rep_;
  if (uVar2 != uVar1) {
    (this->status_).rep_ = uVar2;
    (other->status_).rep_ = 0x37;
    if ((uVar1 & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
  }
  std::__cxx11::string::operator=((string *)&this->what_,(string *)&other->what_);
  return this;
}

Assistant:

BadStatusOrAccess& BadStatusOrAccess::operator=(BadStatusOrAccess&& other) {
  // Ensure assignment is correct regardless of whether this->InitWhat() has
  // already been called.
  other.InitWhat();
  status_ = std::move(other.status_);
  what_ = std::move(other.what_);
  return *this;
}